

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O2

int main(void)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  undefined1 local_149;
  Data data;
  array<char,_256UL> buf;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    pcVar3 = fgets(buf._M_elems,0x100,_stdin);
    if (pcVar3 == (char *)0x0) break;
    iVar2 = bcmp(">THREE",&buf,6);
  } while (iVar2 != 0);
  while (pcVar3 = fgets(buf._M_elems,0x100,_stdin),
        pbVar4 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start, pcVar3 != (char *)0x0) {
    if (buf._M_elems[0] != ';') {
      if (buf._M_elems[0] == '>') break;
      local_149 = 10;
      pcVar3 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (&buf,&stack0xffffffffffffffd8,&local_149);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
                 (const_iterator)
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,buf._M_elems,pcVar3);
    }
  }
  for (; lVar1 = std::cout,
      pbVar4 != data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
    *pbVar4 = cfg.to_num[*pbVar4];
  }
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 3;
  *(uint *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) | 4;
  WriteFrequencies<1u>(&data);
  WriteFrequencies<2u>(&data);
  WriteCount<3u>(&data,"GGT");
  WriteCount<4u>(&data,"GGTA");
  WriteCount<6u>(&data,"GGTATT");
  WriteCount<12u>(&data,"GGTATTTTAATT");
  WriteCount<18u>(&data,"GGTATTTTAATTTATAGT");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return 0;
}

Assistant:

int main()
{
    Cfg::Data data;
    std::array<char, 256> buf;

    while(fgets(buf.data(), static_cast<int>(buf.size()), stdin) && memcmp(">THREE", buf.data(), 6));
    while(fgets(buf.data(), static_cast<int>(buf.size()), stdin) && buf.front() != '>') {
        if(buf.front() != ';'){
            auto i = std::find(buf.begin(), buf.end(), '\n');
            data.insert(data.end(), buf.begin(), i);
        }
    }
    std::transform(data.begin(), data.end(), data.begin(), [](unsigned char c){
        return cfg.to_num[c];
    });
    std::cout << std::setprecision(3) << std::setiosflags(std::ios::fixed);

    WriteFrequencies<1>(data);
    WriteFrequencies<2>(data);
    // value at left is the length of the passed string.
    WriteCount<3>(data, "GGT");
    WriteCount<4>(data, "GGTA");
    WriteCount<6>(data, "GGTATT");
    WriteCount<12>(data, "GGTATTTTAATT");
    WriteCount<18>(data, "GGTATTTTAATTTATAGT");
}